

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  bool bVar1;
  iterator this_00;
  reference ppTVar2;
  reference ppTVar3;
  int in_ESI;
  string *in_RDI;
  string *in_stack_00000008;
  PositiveAndNegativeUnitTestFilter *in_stack_00000010;
  bool is_selected;
  bool is_in_another_shard;
  bool is_runnable;
  bool matches_filter;
  bool is_disabled;
  string *test_name;
  TestInfo *test_info;
  iterator __end3;
  iterator __begin3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *__range3;
  string *test_suite_name;
  TestSuite *test_suite;
  iterator __end2;
  iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int num_selected_tests;
  int num_runnable_tests;
  UnitTestFilter disable_test_filter;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  int32_t shard_index;
  int32_t total_shards;
  undefined4 in_stack_fffffffffffffe28;
  int iVar4;
  undefined3 uVar5;
  undefined4 in_stack_fffffffffffffe2c;
  TestSuite *in_stack_fffffffffffffe30;
  byte local_1c7;
  byte local_1c6;
  bool local_1c5;
  bool local_1c2;
  int local_1b0;
  int local_1ac;
  uint in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe64;
  byte in_stack_fffffffffffffe65;
  undefined1 in_stack_fffffffffffffe66;
  byte in_stack_fffffffffffffe67;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  TestInfo *pTVar6;
  char *in_stack_fffffffffffffe78;
  __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
  local_180;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *local_178;
  string *test_name_00;
  TestSuite *this_01;
  __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
  local_158;
  undefined1 *local_150;
  int local_144;
  int local_140;
  allocator<char> local_129;
  string local_128 [144];
  string *in_stack_ffffffffffffff68;
  UnitTestFilter *in_stack_ffffffffffffff70;
  
  if (in_ESI == 0) {
    local_1ac = Int32FromEnvOrDie(in_stack_fffffffffffffe78,
                                  (int32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    local_1b0 = Int32FromEnvOrDie(in_stack_fffffffffffffe78,
                                  (int32_t)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    local_1c5 = (bool)in_stack_fffffffffffffe65;
  }
  else {
    local_1ac = -1;
    local_1b0 = -1;
    local_1c5 = (bool)in_stack_fffffffffffffe65;
  }
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (in_stack_00000010,in_stack_00000008);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffffe67,
                      CONCAT16(in_stack_fffffffffffffe66,
                               CONCAT15(local_1c5,
                                        CONCAT14(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60
                                                )))));
  anon_unknown_37::UnitTestFilter::UnitTestFilter
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_140 = 0;
  local_144 = 0;
  local_150 = (undefined1 *)((long)&in_RDI[5].field_2 + 8);
  local_158._M_current =
       (TestSuite **)
       std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                 ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  this_00 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                      ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)in_stack_fffffffffffffe30,
                            (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)), bVar1
        ) {
    ppTVar2 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&local_158);
    this_01 = *ppTVar2;
    test_name_00 = &this_01->name_;
    TestSuite::set_should_run(this_01,false);
    local_178 = TestSuite::test_info_list(this_01);
    local_180._M_current =
         (TestInfo **)
         std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                   ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
                    CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
              ((vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)),
          bVar1) {
      ppTVar3 = __gnu_cxx::
                __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
                ::operator*(&local_180);
      pTVar6 = *ppTVar3;
      bVar1 = anon_unknown_37::UnitTestFilter::MatchesName
                        ((UnitTestFilter *)
                         CONCAT17(in_stack_fffffffffffffe67,
                                  CONCAT16(in_stack_fffffffffffffe66,
                                           CONCAT15(local_1c5,
                                                    CONCAT14(in_stack_fffffffffffffe64,
                                                             in_stack_fffffffffffffe60)))),in_RDI);
      local_1c2 = true;
      in_stack_fffffffffffffe30 = this_01;
      if (!bVar1) {
        local_1c2 = anon_unknown_37::UnitTestFilter::MatchesName
                              ((UnitTestFilter *)
                               CONCAT17(in_stack_fffffffffffffe67,
                                        CONCAT16(in_stack_fffffffffffffe66,
                                                 CONCAT15(local_1c5,
                                                          CONCAT14(in_stack_fffffffffffffe64,
                                                                   in_stack_fffffffffffffe60)))),
                               in_RDI);
        in_stack_fffffffffffffe30 = this_01;
      }
      pTVar6->is_disabled_ = local_1c2;
      in_stack_fffffffffffffe66 =
           anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                     ((PositiveAndNegativeUnitTestFilter *)this_00._M_current,
                      (string *)in_stack_fffffffffffffe30,test_name_00);
      pTVar6->matches_filter_ = (bool)in_stack_fffffffffffffe66;
      if (((FLAGS_gtest_also_run_disabled_tests & 1) != 0) ||
         (local_1c5 = false, (local_1c2 & 1U) == 0)) {
        local_1c5 = (bool)in_stack_fffffffffffffe66;
      }
      local_1c6 = 0;
      in_stack_fffffffffffffe67 = local_1c2;
      if (in_ESI != 1) {
        bVar1 = ShouldRunTestOnShard(local_1ac,local_1b0,local_140);
        local_1c6 = bVar1 ^ 0xff;
        in_stack_fffffffffffffe67 = local_1c2;
      }
      in_stack_fffffffffffffe64 = local_1c6 & 1;
      pTVar6->is_in_another_shard_ = (bool)in_stack_fffffffffffffe64;
      local_1c7 = 0;
      if ((local_1c5 & 1U) != 0) {
        local_1c7 = in_stack_fffffffffffffe64 ^ 0xff;
      }
      in_stack_fffffffffffffe60 = CONCAT13(local_1c7,(int3)in_stack_fffffffffffffe60) & 0x1ffffff;
      local_140 = local_140 + (local_1c5 & 1);
      bVar1 = SUB41(in_stack_fffffffffffffe60 >> 0x18,0);
      local_144 = local_144 + (uint)bVar1;
      pTVar6->should_run_ = bVar1;
      this_01 = in_stack_fffffffffffffe30;
      bVar1 = TestSuite::should_run(in_stack_fffffffffffffe30);
      uVar5 = (undefined3)in_stack_fffffffffffffe2c;
      in_stack_fffffffffffffe2c = CONCAT13(1,uVar5);
      if (!bVar1) {
        in_stack_fffffffffffffe2c = CONCAT13((char)(in_stack_fffffffffffffe60 >> 0x18),uVar5);
      }
      TestSuite::set_should_run
                (in_stack_fffffffffffffe30,
                 (bool)((byte)((uint)in_stack_fffffffffffffe2c >> 0x18) & 1));
      __gnu_cxx::
      __normal_iterator<testing::TestInfo_**,_std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>_>
      ::operator++(&local_180);
    }
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&local_158);
  }
  iVar4 = local_144;
  anon_unknown_37::UnitTestFilter::~UnitTestFilter((UnitTestFilter *)in_stack_fffffffffffffe30);
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)in_stack_fffffffffffffe30);
  return iVar4;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    test_suite->set_should_run(false);

    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}